

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

size_t __thiscall
kj::_::
SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:56:51)>
::anon_class_16_2_928cd080_for_func::operator()
          (anon_class_16_2_928cd080_for_func *this,size_t result)

{
  char (*in_RCX) [32];
  Array<char> AStack_1c8;
  Exception local_1b0;
  
  if (result < this->minBytes) {
    Debug::makeDescription<char_const(&)[32]>
              ((String *)&AStack_1c8,(Debug *)"\"stream disconnected prematurely\"",
               "stream disconnected prematurely",in_RCX);
    Exception::Exception
              (&local_1b0,DISCONNECTED,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x3c,(String *)&AStack_1c8);
    throwRecoverableException(&local_1b0,0);
    Exception::~Exception(&local_1b0);
    Array<char>::~Array(&AStack_1c8);
    memset((void *)((long)this->buffer + result),0,this->minBytes - result);
    result = this->minBytes;
  }
  return result;
}

Assistant:

Promise<size_t> AsyncInputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  return tryRead(buffer, minBytes, maxBytes).then([=](size_t result) {
    if (result >= minBytes) {
      return result;
    } else {
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "stream disconnected prematurely"));
      // Pretend we read zeros from the input.
      memset(reinterpret_cast<byte*>(buffer) + result, 0, minBytes - result);
      return minBytes;
    }
  });
}